

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

MemFile * memdbFromDbSchema(sqlite3 *db,char *zSchema)

{
  MemStore *pMVar1;
  int iVar2;
  MemFile *p;
  
  p = (MemFile *)0x0;
  iVar2 = sqlite3_file_control(db,zSchema,7,&p);
  if ((iVar2 == 0) && ((p->base).pMethods == &memdb_io_methods)) {
    pMVar1 = p->pStore;
    if (pMVar1->pMutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(pMVar1->pMutex);
    }
    if (pMVar1->zFName != (char *)0x0) {
      p = (MemFile *)0x0;
    }
    if (pMVar1->pMutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(pMVar1->pMutex);
    }
  }
  else {
    p = (MemFile *)0x0;
  }
  return p;
}

Assistant:

static MemFile *memdbFromDbSchema(sqlite3 *db, const char *zSchema){
  MemFile *p = 0;
  MemStore *pStore;
  int rc = sqlite3_file_control(db, zSchema, SQLITE_FCNTL_FILE_POINTER, &p);
  if( rc ) return 0;
  if( p->base.pMethods!=&memdb_io_methods ) return 0;
  pStore = p->pStore;
  memdbEnter(pStore);
  if( pStore->zFName!=0 ) p = 0;
  memdbLeave(pStore);
  return p;
}